

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O1

int X509_CRL_set1_nextUpdate(X509_CRL *x,ASN1_TIME *tm)

{
  ASN1_STRING *pAVar1;
  
  if (x != (X509_CRL *)0x0) {
    pAVar1 = (ASN1_STRING *)x->crl->nextUpdate;
    if (pAVar1 != (ASN1_STRING *)tm) {
      pAVar1 = ASN1_STRING_dup((ASN1_STRING *)tm);
      if (pAVar1 == (ASN1_STRING *)0x0) {
        pAVar1 = (ASN1_STRING *)0x0;
      }
      else {
        ASN1_TIME_free((ASN1_TIME *)x->crl->nextUpdate);
        x->crl->nextUpdate = (ASN1_TIME *)pAVar1;
      }
    }
    return (int)(pAVar1 != (ASN1_STRING *)0x0);
  }
  return 0;
}

Assistant:

int X509_CRL_set1_nextUpdate(X509_CRL *x, const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if (x == NULL) {
    return 0;
  }
  in = x->crl->nextUpdate;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(x->crl->nextUpdate);
      x->crl->nextUpdate = in;
    }
  }
  return in != NULL;
}